

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall celero::Printer::TableResult(Printer *this,shared_ptr<celero::ExperimentResult> *x)

{
  int64_t x_00;
  mapped_type *pmVar1;
  iterator iVar2;
  undefined8 uVar3;
  ConsoleColor x_01;
  ulong uVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer pbVar7;
  long lVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *entry;
  double dVar9;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  udmValues;
  shared_ptr<celero::UserDefinedMeasurementCollector> udmCollector;
  undefined1 local_c0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined4 local_80;
  undefined8 local_78;
  __node_base_ptr p_Stack_70;
  undefined1 local_68 [32];
  mapped_type local_48;
  UserDefinedMeasurementCollector *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  key_type *__k;
  
  console::SetConsoleColor(Default);
  dVar9 = ExperimentResult::getBaselineMeasurement
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  x_01 = Yellow;
  if (dVar9 <= 1.0) {
    dVar9 = ExperimentResult::getBaselineMeasurement
                      ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr);
    x_01 = (uint)(1.0 <= dVar9) * 4 + Green;
  }
  console::SetConsoleColor(x_01);
  dVar9 = ExperimentResult::getBaselineMeasurement
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  PrintColumn_abi_cxx11_((string *)&local_a0,dVar9,5,0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_a0._M_allocated_capacity,local_a0._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
  }
  console::SetConsoleColor(Default);
  console::SetConsoleColor(x_01);
  dVar9 = ExperimentResult::getUsPerCall
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  PrintColumn_abi_cxx11_((string *)&local_a0,dVar9,5,0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_a0._M_allocated_capacity,local_a0._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
  }
  console::SetConsoleColor(Default);
  console::SetConsoleColor(x_01);
  dVar9 = ExperimentResult::getCallsPerSecond
                    ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr);
  PrintColumn_abi_cxx11_((string *)&local_a0,dVar9,2,0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_a0._M_allocated_capacity,local_a0._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
  }
  console::SetConsoleColor(Default);
  console::SetConsoleColor(x_01);
  x_00 = ExperimentResult::getRAM
                   ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
  PrintColumn_abi_cxx11_((string *)&local_a0,x_00,0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_a0._M_allocated_capacity,local_a0._8_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_allocated_capacity != &local_90) {
    operator_delete((void *)local_a0._M_allocated_capacity,local_90._M_allocated_capacity + 1);
  }
  console::SetConsoleColor(Default);
  local_a0._M_allocated_capacity = (size_type)&p_Stack_70;
  local_a0._8_8_ = 1;
  local_90._M_allocated_capacity = 0;
  local_90._8_8_ = 0;
  local_80 = 0x3f800000;
  local_78 = 0;
  p_Stack_70 = (__node_base_ptr)0x0;
  ExperimentResult::getUserDefinedMeasurements
            ((x->super___shared_ptr<celero::ExperimentResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  UserDefinedMeasurementCollector::getAggregateValues_abi_cxx11_
            ((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
              *)local_c0,local_40);
  uVar3 = local_c0._8_8_;
  if (local_c0._0_8_ != local_c0._8_8_) {
    ppVar5 = (pointer)local_c0._0_8_;
    do {
      local_48 = ppVar5->second;
      pmVar1 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)local_a0._M_local_buf,&ppVar5->first);
      *pmVar1 = local_48;
      ppVar5 = ppVar5 + 1;
    } while (ppVar5 != (pointer)uVar3);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             *)local_c0);
  pbVar7 = (this->userDefinedColumns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->userDefinedColumns).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    lVar8 = 0;
    uVar4 = 0;
    do {
      __k = (key_type *)((long)&(pbVar7->_M_dataplus)._M_p + lVar8);
      iVar2 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&local_a0,__k);
      if (iVar2.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_68._0_8_ = local_68 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"---","");
        PrintCenter((string *)local_c0,(string *)local_68,
                    (this->columnWidths).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4 + 9]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_c0._0_8_,local_c0._8_8_);
        if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
          operator_delete((void *)local_c0._0_8_,(ulong)(local_c0._16_8_ + 1));
        }
        ppVar5 = (pointer)local_68._16_8_;
        ppVar6 = (pointer)local_68._0_8_;
        if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) goto LAB_00130f4b;
      }
      else {
        iVar2 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&local_a0,__k);
        if (iVar2.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
            ._M_cur == (__node_type *)0x0) {
          uVar3 = std::__throw_out_of_range("_Map_base::at");
          if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)&local_a0);
          _Unwind_Resume(uVar3);
        }
        PrintColumn_abi_cxx11_
                  ((string *)local_c0,
                   *(double *)
                    ((long)iVar2.
                           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_true>
                           ._M_cur + 0x28),2,
                   (this->columnWidths).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar4 + 9]);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_c0._0_8_,local_c0._8_8_);
        ppVar5 = (pointer)local_c0._16_8_;
        ppVar6 = (pointer)local_c0._0_8_;
        if ((pointer)local_c0._0_8_ != (pointer)(local_c0 + 0x10)) {
LAB_00130f4b:
          operator_delete(ppVar6,(ulong)((long)&(ppVar5->first)._M_dataplus._M_p + 1));
        }
      }
      uVar4 = uVar4 + 1;
      pbVar7 = (this->userDefinedColumns).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x20;
    } while (uVar4 < (ulong)((long)(this->userDefinedColumns).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&local_a0);
  return;
}

Assistant:

void Printer::TableResult(std::shared_ptr<celero::ExperimentResult> x)
	{
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::ConsoleColor temp_color;

		// Slower than Baseline
		if(x->getBaselineMeasurement() > 1.0)
		{
			temp_color = celero::console::ConsoleColor::Yellow;
		}
		else if(x->getBaselineMeasurement() < 1.0)
		{
			temp_color = celero::console::ConsoleColor::Green;
		}
		else
		{
			temp_color = celero::console::ConsoleColor::Cyan;
		}

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getBaselineMeasurement());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getUsPerCall());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getCallsPerSecond(), 2);
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		celero::console::SetConsoleColor(temp_color);
		std::cout << PrintColumn(x->getRAM());
		celero::console::SetConsoleColor(celero::console::ConsoleColor::Default);

		std::unordered_map<std::string, double> udmValues;

		auto udmCollector = x->getUserDefinedMeasurements();
		for(const auto& entry : udmCollector->getAggregateValues())
		{
			udmValues[entry.first] = entry.second;
		}

		for(size_t i = 0; i < this->userDefinedColumns.size(); ++i)
		{
			const auto& fieldName = this->userDefinedColumns[i];

			if(udmValues.find(fieldName) == udmValues.end())
			{
				std::cout << PrintCenter("---", this->columnWidths[i + PrintConstants::NumberOfColumns]);
			}
			else
			{
				std::cout << PrintColumn(udmValues.at(fieldName), 2, this->columnWidths[i + PrintConstants::NumberOfColumns]);
			}
		}

		std::cout << "\n";
	}